

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O0

void __thiscall Index::~Index(Index *this)

{
  long in_RDI;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector(unaff_retaddr);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x117a34);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}